

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O2

void __thiscall BarrierTest_Wait_Test::TestBody(BarrierTest_Wait_Test *this)

{
  bool bVar1;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  uint local_b0 [9];
  arrival_token token;
  barrier<yamc::detail::default_barrier_completion> barrier;
  
  yamc::barrier<yamc::detail::default_barrier_completion>::barrier(&barrier,1);
  local_c0 = 0;
  uStack_b8 = 0;
  local_c8 = 0;
  local_d0 = &local_c0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_b0[0] = (uint)yamc::barrier<yamc::detail::default_barrier_completion>::arrive(&barrier,1);
    yamc::barrier<yamc::detail::default_barrier_completion>::wait(&barrier,local_b0);
  }
  std::__cxx11::string::~string((string *)&local_d0);
  token = yamc::barrier<yamc::detail::default_barrier_completion>::arrive(&barrier,1);
  local_c0 = 0;
  uStack_b8 = 0;
  local_c8 = 0;
  local_d0 = &local_c0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::barrier<yamc::detail::default_barrier_completion>::wait(&barrier,&token);
  }
  std::__cxx11::string::~string((string *)&local_d0);
  std::condition_variable::~condition_variable(&barrier.cv_);
  return;
}

Assistant:

TEST(BarrierTest, Wait)
{
  yamc::barrier<> barrier{1};
  EXPECT_NO_THROW(barrier.wait(barrier.arrive()));
  auto token = barrier.arrive();
  EXPECT_NO_THROW(barrier.wait(std::move(token)));
}